

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O2

error_code pstore::exchange::import_ns::fragment_sections::check_fragment(fragment *f)

{
  uint uVar1;
  error_category *peVar2;
  debug_line_section *pdVar3;
  const_pointer piVar4;
  long lVar5;
  generic_section *s;
  const_pointer piVar6;
  error_category *peVar7;
  error e;
  long lVar8;
  container<pstore::repo::internal_fixup> cVar9;
  error_code eVar10;
  const_iterator it;
  const_iterator end;
  
  peVar2 = (error_category *)std::_V2::system_category();
  repo::fragment::begin(&it,f);
  repo::fragment::end(&end,f);
  uVar1 = 0;
  peVar7 = peVar2;
  do {
    if ((it.it_.bitmap_ == end.it_.bitmap_) || (uVar1 != 0)) {
      eVar10._4_4_ = 0;
      eVar10._M_value = uVar1;
      eVar10._M_cat = peVar7;
      return eVar10;
    }
    uVar1 = 0;
    it.value_ = (value_type)it.it_.pos_;
    switch((value_type)it.it_.pos_) {
    case text:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)0,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case data:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)1,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case bss:
      repo::fragment::
      at_impl<(pstore::repo::section_kind)2,pstore::repo::fragment_const&,pstore::repo::bss_section_const>
                (f);
      e = none;
      goto LAB_001a0967;
    case rel_ro:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)3,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_1_byte_c_string:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)4,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_2_byte_c_string:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)5,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_4_byte_c_string:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)6,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_const_4:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)7,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_const_8:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)8,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_const_16:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)9,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case mergeable_const_32:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)10,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case read_only:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)11,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case thread_data:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)12,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case thread_bss:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)13,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case debug_line:
      pdVar3 = repo::fragment::
               at_impl<(pstore::repo::section_kind)14,pstore::repo::fragment_const&,pstore::repo::debug_line_section_const>
                         (f);
      cVar9 = repo::generic_section::ifixups(&pdVar3->g_);
      piVar6 = cVar9.end_;
      piVar4 = cVar9.begin_;
      lVar8 = (long)piVar6 - (long)piVar4;
      uVar1 = (f->arr_).sa_.bitmap_;
      for (lVar5 = lVar8 / 0x18 >> 2; 0 < lVar5; lVar5 = lVar5 + -1) {
        if (((debug_string|debug_loc) < piVar4->section) ||
           ((1 << (piVar4->section & (debug_string|debug_loc)) & uVar1) == 0)) goto LAB_001a0959;
        if (((debug_string|debug_loc) < piVar4[1].section) ||
           ((1 << (piVar4[1].section & (debug_string|debug_loc)) & uVar1) == 0)) {
          piVar4 = piVar4 + 1;
          goto LAB_001a0959;
        }
        if (((debug_string|debug_loc) < piVar4[2].section) ||
           ((1 << (piVar4[2].section & (debug_string|debug_loc)) & uVar1) == 0)) {
          piVar4 = piVar4 + 2;
          goto LAB_001a0959;
        }
        if (((debug_string|debug_loc) < piVar4[3].section) ||
           ((1 << (piVar4[3].section & (debug_string|debug_loc)) & uVar1) == 0)) {
          piVar4 = piVar4 + 3;
          goto LAB_001a0959;
        }
        piVar4 = piVar4 + 4;
        lVar8 = lVar8 + -0x60;
      }
      lVar8 = lVar8 / 0x18;
      if (lVar8 == 1) {
LAB_001a0933:
        if ((piVar4->section < 0x20) &&
           ((1 << (piVar4->section & (debug_string|debug_loc)) & uVar1) != 0)) {
LAB_001a0944:
          piVar4 = piVar6;
        }
      }
      else if (lVar8 == 2) {
LAB_001a091e:
        if ((piVar4->section < 0x20) &&
           ((1 << (piVar4->section & (debug_string|debug_loc)) & uVar1) != 0)) {
          piVar4 = piVar4 + 1;
          goto LAB_001a0933;
        }
      }
      else {
        if (lVar8 != 3) goto LAB_001a0944;
        if ((piVar4->section < 0x20) &&
           ((1 << (piVar4->section & (debug_string|debug_loc)) & uVar1) != 0)) {
          piVar4 = piVar4 + 1;
          goto LAB_001a091e;
        }
      }
LAB_001a0959:
      e = internal_fixup_target_not_found;
      if (piVar4 == piVar6) {
        e = none;
      }
LAB_001a0967:
      eVar10 = make_error_code(e);
      goto LAB_001a08da;
    case debug_loc:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)15,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case debug_string:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)16,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case debug_ranges:
      s = repo::fragment::
          at_impl<(pstore::repo::section_kind)17,pstore::repo::fragment_const&,pstore::repo::generic_section_const>
                    (f);
      break;
    case linked_definitions:
      repo::fragment::
      at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment_const&,pstore::repo::linked_definitions_const>
                (f);
      peVar7 = peVar2;
      goto switchD_001a0756_default;
    case last:
      assert_failed("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/exchange/import_fragment.cpp"
                    ,0x99);
    default:
      goto switchD_001a0756_default;
    }
    eVar10 = anon_unknown.dwarf_5dc84f::validate_section_ifixups<pstore::repo::generic_section>(f,s)
    ;
LAB_001a08da:
    peVar7 = eVar10._M_cat;
    uVar1 = eVar10._M_value;
switchD_001a0756_default:
    sparse_array<unsigned_long,_unsigned_int>::indices::const_iterator::operator++(&it.it_);
  } while( true );
}

Assistant:

std::error_code fragment_sections::check_fragment (repo::fragment const & f) {
                std::error_code error;
                for (auto it = f.begin (), end = f.end (); it != end && !error; ++it) {
                    repo::section_kind const kind = *it;
#define X(k)                                                                                       \
    case repo::section_kind::k:                                                                    \
        error = validate_section_ifixups (f, f.at<repo::section_kind::k> ());                      \
        break;
                    switch (kind) {
                        PSTORE_MCREPO_SECTION_KINDS
                    case repo::section_kind::last:
                        PSTORE_ASSERT (false); //! OCLINT(PH - don't warn about the assert macro)
                        break;
                    }
#undef X
                }
                return error;
            }